

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolOcclusionTests.cpp
# Opt level: O2

void __thiscall
vkt::QueryPool::anon_unknown_0::OcclusionQueryTestInstance::~OcclusionQueryTestInstance
          (OcclusionQueryTestInstance *this)

{
  StateObjects *this_00;
  VkDevice pVVar1;
  DeviceInterface *pDVar2;
  
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__OcclusionQueryTestInstance_00bd6bc8;
  pVVar1 = Context::getDevice((this->super_TestInstance).m_context);
  this_00 = this->m_stateObjects;
  if (this_00 != (StateObjects *)0x0) {
    StateObjects::~StateObjects(this_00);
    operator_delete(this_00,0x100);
  }
  if ((this->m_queryPool).m_internal != 0) {
    pDVar2 = Context::getDeviceInterface((this->super_TestInstance).m_context);
    (*pDVar2->_vptr_DeviceInterface[0x1f])(pDVar2,pVVar1,(this->m_queryPool).m_internal,0);
  }
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            (&(this->m_copyResultsCommandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            (&(this->m_renderCommandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            (&(this->m_queryPoolResetCommandBuffer).super_RefBase<vk::VkCommandBuffer_s_*>);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            (&(this->m_commandPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  de::SharedPtr<vkt::Draw::Buffer>::release(&this->m_queryPoolResultsBuffer);
  return;
}

Assistant:

OcclusionQueryTestInstance::~OcclusionQueryTestInstance (void)
{
	const vk::VkDevice device = m_context.getDevice();

	if (m_stateObjects)
		delete m_stateObjects;

	if (m_queryPool != DE_NULL)
	{
		const vk::DeviceInterface& vk = m_context.getDeviceInterface();
		vk.destroyQueryPool(device, m_queryPool, /*pAllocator*/ DE_NULL);
	}
}